

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O0

void __thiscall
ContractTestOnClassWithOutInvariant_ThatWhenNoFunctionWasCalledNoConditionWasCalled_Test::TestBody
          (ContractTestOnClassWithOutInvariant_ThatWhenNoFunctionWasCalledNoConditionWasCalled_Test
           *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined1 in_stack_ffffffffffffff3f;
  AssertionResult *in_stack_ffffffffffffff40;
  AssertionResult *pAVar3;
  int line;
  undefined7 in_stack_ffffffffffffff60;
  string local_98 [4];
  Type in_stack_ffffffffffffff6c;
  AssertHelper *in_stack_ffffffffffffff70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  AssertionResult *in_stack_ffffffffffffffb8;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertionResult local_18;
  
  pAVar3 = &local_18;
  testing::AssertionResult::AssertionResult
            (in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  line = (int)((ulong)pAVar3 >> 0x20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (char *)in_stack_ffffffffffffffa0.ptr_);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
               (char *)CONCAT17(uVar1,in_stack_ffffffffffffff60),line,in_RDI);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffffc0,(Message *)in_stack_ffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff40);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    testing::Message::~Message((Message *)0x140e21);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x140e96);
  pAVar3 = (AssertionResult *)&stack0xffffffffffffff98;
  testing::AssertionResult::AssertionResult(pAVar3,(bool)in_stack_ffffffffffffff3f);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (char *)in_stack_ffffffffffffffa0.ptr_);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
               (char *)CONCAT17(uVar1,in_stack_ffffffffffffff60),line,in_RDI);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffffc0,(Message *)in_stack_ffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar3);
    std::__cxx11::string::~string(local_98);
    testing::Message::~Message((Message *)0x140f8a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x140ff6);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithOutInvariant, ThatWhenNoFunctionWasCalledNoConditionWasCalled)
{
  EXPECT_FALSE(sut.preConditionWasCalled);
  EXPECT_FALSE(sut.postConditionWasCalled);
}